

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int consume_one_frame(amqp_connection_state_t state,amqp_frame_t *decoded_frame)

{
  uint uVar1;
  amqp_bytes_t received_data;
  
  received_data.len = state->sock_inbound_limit - state->sock_inbound_offset;
  received_data.bytes =
       (void *)(state->sock_inbound_offset + (long)(state->sock_inbound_buffer).bytes);
  uVar1 = amqp_handle_input(state,received_data,decoded_frame);
  if (-1 < (int)uVar1) {
    state->sock_inbound_offset = state->sock_inbound_offset + (ulong)uVar1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static int consume_one_frame(amqp_connection_state_t state,
                             amqp_frame_t *decoded_frame) {
  int res;

  amqp_bytes_t buffer;
  buffer.len = state->sock_inbound_limit - state->sock_inbound_offset;
  buffer.bytes =
      ((char *)state->sock_inbound_buffer.bytes) + state->sock_inbound_offset;

  res = amqp_handle_input(state, buffer, decoded_frame);
  if (res < 0) {
    return res;
  }

  state->sock_inbound_offset += res;

  return AMQP_STATUS_OK;
}